

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_true>::push_back
          (SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_true> *this,
          pair<void_*,_unsigned_long> *Elt)

{
  undefined8 *puVar1;
  unsigned_long uVar2;
  uint uVar3;
  
  uVar3 = (this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
          super_SmallVectorBase.Size;
  if ((this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
      super_SmallVectorBase.Capacity <= uVar3) {
    SmallVectorBase::grow_pod((SmallVectorBase *)this,this + 1,0,0x10);
    uVar3 = (this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
            super_SmallVectorBase.Size;
  }
  uVar2 = Elt->second;
  puVar1 = (undefined8 *)
           ((long)(this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
                  super_SmallVectorBase.BeginX + (ulong)uVar3 * 0x10);
  *puVar1 = Elt->first;
  puVar1[1] = uVar2;
  uVar3 = (this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
          super_SmallVectorBase.Size;
  if (uVar3 < (this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
              super_SmallVectorBase.Capacity) {
    (this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
    super_SmallVectorBase.Size = uVar3 + 1;
    return;
  }
  __assert_fail("Size <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void push_back(const T &Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    memcpy(this->end(), &Elt, sizeof(T));
    this->set_size(this->size() + 1);
  }